

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall
cmake::Build(cmake *this,int jobs,string *dir,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *targets,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,cmBuildOptions *buildOptions,bool verbose,string *presetName,
            bool listPresets)

{
  _Base_ptr p_Var1;
  _Base_ptr __k;
  pointer pcVar2;
  size_type sVar3;
  cmState *pcVar4;
  cmGlobalGenerator *pcVar5;
  pointer pbVar6;
  bool bVar7;
  ReadFileResult result;
  int iVar8;
  int iVar9;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar10;
  string *psVar11;
  char *__s;
  cmValue cVar12;
  iterator iVar13;
  ostream *poVar14;
  iterator iVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar16;
  undefined7 uVar17;
  char *extraout_RDX;
  undefined4 in_register_00000034;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string local_928;
  undefined4 local_904;
  ulong local_900;
  string projName;
  _Head_base<0UL,_cmGlobalGenerator_*,_false> local_8b0;
  undefined1 local_8a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_890;
  string *local_880;
  string cachePath;
  string output;
  undefined1 local_808 [32];
  _Base_ptr local_7e8;
  _Alloc_hider local_7e0;
  undefined1 local_7d8 [8];
  undefined1 local_7d0 [32];
  _Manager_type local_7b0;
  _Rb_tree_node_base local_7a0;
  size_t local_780;
  _Rb_tree_node_base local_770;
  _Base_ptr local_750;
  _Rb_tree_node_base local_740;
  pointer local_720;
  pointer pbStack_718;
  pointer local_710;
  pointer pbStack_708;
  __node_base local_700;
  pointer pbStack_6f8;
  pointer local_6f0;
  pointer pbStack_6e8;
  pointer local_6e0;
  pointer pbStack_6d8;
  pointer local_6d0;
  __node_base _Stack_6c8;
  pointer local_6c0;
  pointer pbStack_6b8;
  pointer local_6b0;
  pointer pbStack_6a8;
  _Alloc_hider local_6a0;
  size_type local_698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_690;
  _Base_ptr local_680;
  pointer puStack_678;
  pointer local_670;
  
  local_900 = CONCAT44(in_register_00000034,jobs);
  paVar18 = &output.field_2;
  output._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)&output,"");
  SetHomeDirectory(this,&output);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output._M_dataplus._M_p != paVar18) {
    operator_delete(output._M_dataplus._M_p,
                    CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                             output.field_2._M_local_buf[0]) + 1);
  }
  output._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)&output,"");
  SetHomeOutputDirectory(this,&output);
  uVar10 = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output._M_dataplus._M_p != paVar18) {
    operator_delete(output._M_dataplus._M_p,
                    CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                             output.field_2._M_local_buf[0]) + 1);
    uVar10 = extraout_RAX_00;
  }
  local_904 = (undefined4)CONCAT71((int7)((ulong)uVar10 >> 8),verbose);
  if (presetName->_M_string_length == 0 && !listPresets) {
LAB_002137d0:
    paVar18 = &output.field_2;
    bVar7 = cmsys::SystemTools::FileIsDirectory(dir);
    if (!bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: ",7);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(dir->_M_dataplus)._M_p,dir->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," is not a directory\n",0x14);
      return 1;
    }
    FindCacheFile(&cachePath,dir);
    bVar7 = LoadCache(this,&cachePath);
    if (bVar7) {
      pcVar4 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
               .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      output._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)&output,"CMAKE_GENERATOR","");
      cVar12 = cmState::GetCacheEntryValue(pcVar4,&output);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)output._M_dataplus._M_p != paVar18) {
        operator_delete(output._M_dataplus._M_p,
                        CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                 output.field_2._M_local_buf[0]) + 1);
      }
      if (cVar12.Value == (string *)0x0) {
        iVar9 = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n",0x2f);
      }
      else {
        CreateGlobalGenerator((cmake *)local_8a8,(string *)this,SUB81(cVar12.Value,0));
        if ((cmGlobalGenerator *)local_8a8._0_8_ == (cmGlobalGenerator *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error: could not create CMAKE_GENERATOR \"",0x29);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,((cVar12.Value)->_M_dataplus)._M_p,
                               (cVar12.Value)->_M_string_length);
          iVar9 = 1;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\"\n",2);
        }
        else {
          local_8b0._M_head_impl = (cmGlobalGenerator *)local_8a8._0_8_;
          local_8a8._0_8_ = (cmGlobalGenerator *)0x0;
          SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                                   *)&local_8b0);
          if (local_8b0._M_head_impl != (cmGlobalGenerator *)0x0) {
            (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                         *)&(local_8b0._M_head_impl)->_vptr_cmGlobalGenerator)->
                      super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                      )._M_t.
                      super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                      .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                      _vptr_cmGlobalGeneratorFactory)();
          }
          local_8b0._M_head_impl = (cmGlobalGenerator *)0x0;
          pcVar4 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          output._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&output,"CMAKE_GENERATOR_INSTANCE","");
          cVar12 = cmState::GetCacheEntryValue(pcVar4,&output);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)output._M_dataplus._M_p != paVar18) {
            operator_delete(output._M_dataplus._M_p,
                            CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                     output.field_2._M_local_buf[0]) + 1);
          }
          if (cVar12.Value != (string *)0x0) {
            projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
            projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
            projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
            cmMakefile::cmMakefile
                      ((cmMakefile *)&output,
                       (this->GlobalGenerator)._M_t.
                       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                       .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                       (cmStateSnapshot *)&projName);
            pcVar5 = (this->GlobalGenerator)._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
            iVar8 = (*pcVar5->_vptr_cmGlobalGenerator[8])(pcVar5,cVar12.Value,&output);
            cmMakefile::~cmMakefile((cmMakefile *)&output);
            iVar9 = 1;
            if ((char)iVar8 == '\0') goto LAB_00214183;
          }
          pcVar4 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          output._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&output,"CMAKE_GENERATOR_PLATFORM","");
          cVar12 = cmState::GetCacheEntryValue(pcVar4,&output);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)output._M_dataplus._M_p != paVar18) {
            operator_delete(output._M_dataplus._M_p,
                            CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                     output.field_2._M_local_buf[0]) + 1);
          }
          if (cVar12.Value != (string *)0x0) {
            projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
            projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
            projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
            cmMakefile::cmMakefile
                      ((cmMakefile *)&output,
                       (this->GlobalGenerator)._M_t.
                       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                       .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                       (cmStateSnapshot *)&projName);
            pcVar5 = (this->GlobalGenerator)._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
            iVar8 = (*pcVar5->_vptr_cmGlobalGenerator[9])(pcVar5,cVar12.Value,&output);
            cmMakefile::~cmMakefile((cmMakefile *)&output);
            iVar9 = 1;
            if ((char)iVar8 == '\0') goto LAB_00214183;
          }
          pcVar4 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          output._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&output,"CMAKE_GENERATOR_TOOLSET","");
          cVar12 = cmState::GetCacheEntryValue(pcVar4,&output);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)output._M_dataplus._M_p != paVar18) {
            operator_delete(output._M_dataplus._M_p,
                            CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                     output.field_2._M_local_buf[0]) + 1);
          }
          if (cVar12.Value != (string *)0x0) {
            projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
            projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
            projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
            cmMakefile::cmMakefile
                      ((cmMakefile *)&output,
                       (this->GlobalGenerator)._M_t.
                       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                       .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                       (cmStateSnapshot *)&projName);
            pcVar5 = (this->GlobalGenerator)._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
            iVar9 = 1;
            iVar8 = (*pcVar5->_vptr_cmGlobalGenerator[10])(pcVar5,cVar12.Value,1,&output);
            cmMakefile::~cmMakefile((cmMakefile *)&output);
            if ((char)iVar8 == '\0') goto LAB_00214183;
          }
          output._M_string_length = 0;
          output.field_2._M_local_buf[0] = '\0';
          projName._M_dataplus._M_p = (pointer)&projName.field_2;
          projName._M_string_length = 0;
          projName.field_2._M_allocated_capacity =
               projName.field_2._M_allocated_capacity & 0xffffffffffffff00;
          pcVar4 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          output._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_928,"CMAKE_PROJECT_NAME","");
          cVar12 = cmState::GetCacheEntryValue(pcVar4,&local_928);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_928._M_dataplus._M_p != &local_928.field_2) {
            operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
          }
          if (cVar12.Value == (string *)0x0) {
            iVar9 = 1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error: could not find CMAKE_PROJECT_NAME in Cache\n",
                       0x32);
          }
          else {
            std::__cxx11::string::_M_assign((string *)&projName);
            pcVar4 = (this->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
            local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_928,"CMAKE_VERBOSE_MAKEFILE","");
            cVar12 = cmState::GetCacheEntryValue(pcVar4,&local_928);
            if (cVar12.Value == (string *)0x0) {
              bVar7 = false;
            }
            else {
              value._M_str = extraout_RDX;
              value._M_len = (size_t)((cVar12.Value)->_M_dataplus)._M_p;
              bVar7 = cmValue::IsOn((cmValue *)(cVar12.Value)->_M_string_length,value);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_928._M_dataplus._M_p != &local_928.field_2) {
              operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1
                             );
            }
            pcVar5 = (this->GlobalGenerator)._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
            iVar8 = (*pcVar5->_vptr_cmGlobalGenerator[0xb])
                              (pcVar5,(this->State)._M_t.
                                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>
                                      .super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
            iVar9 = 1;
            if ((char)iVar8 != '\0') {
              pcVar5 = (this->GlobalGenerator)._M_t.
                       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                       .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
              (*pcVar5->_vptr_cmGlobalGenerator[0x14])(pcVar5,&std::cerr,local_900);
              pcVar5 = (this->GlobalGenerator)._M_t.
                       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                       .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
              local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_928,"");
              local_8a8._8_8_ = &local_890;
              std::__cxx11::string::_M_construct<char_const*>((string *)(local_8a8 + 8),"");
              iVar9 = cmGlobalGenerator::Build
                                (pcVar5,(int)local_900,&local_928,dir,&projName,targets,&output,
                                 (string *)(local_8a8 + 8),config,buildOptions,
                                 (bool)(bVar7 | (byte)local_904 & 1),(cmDuration)0x0,
                                 OUTPUT_PASSTHROUGH,nativeOptions);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_8a8._8_8_ != &local_890) {
                operator_delete((void *)local_8a8._8_8_,local_890._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_928._M_dataplus._M_p != &local_928.field_2) {
                operator_delete(local_928._M_dataplus._M_p,
                                local_928.field_2._M_allocated_capacity + 1);
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)projName._M_dataplus._M_p != &projName.field_2) {
            operator_delete(projName._M_dataplus._M_p,projName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)output._M_dataplus._M_p != paVar18) {
            operator_delete(output._M_dataplus._M_p,
                            CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                     output.field_2._M_local_buf[0]) + 1);
          }
        }
      }
    }
    else {
      iVar9 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: could not load cache\n",0x1c);
    }
LAB_00214183:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cachePath._M_dataplus._M_p == &cachePath.field_2) {
      return iVar9;
    }
    operator_delete(cachePath._M_dataplus._M_p,cachePath.field_2._M_allocated_capacity + 1);
    return iVar9;
  }
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeDirectory(this,&output);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output._M_dataplus._M_p != paVar18) {
    operator_delete(output._M_dataplus._M_p,
                    CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                             output.field_2._M_local_buf[0]) + 1);
  }
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeOutputDirectory(this,&output);
  local_880 = config;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output._M_dataplus._M_p != paVar18) {
    operator_delete(output._M_dataplus._M_p,
                    CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                             output.field_2._M_local_buf[0]) + 1);
  }
  p_Var1 = (_Base_ptr)(local_808 + 8);
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  local_808._8_4_ = _S_red;
  local_808._16_8_ = (_Base_ptr)0x0;
  local_7e0._M_p = (pointer)0x0;
  local_7d0._0_4_ = _S_red;
  local_7d0._8_8_ = (_Base_ptr)0x0;
  local_7b0 = (_Manager_type)0x0;
  local_7a0._M_left = &local_7a0;
  local_7a0._M_color = _S_red;
  local_7a0._M_parent = (_Base_ptr)0x0;
  local_780 = 0;
  local_770._M_left = &local_770;
  local_770._M_color = _S_red;
  local_770._M_parent = (_Base_ptr)0x0;
  local_750 = (_Base_ptr)0x0;
  local_740._M_left = &local_740;
  local_740._M_color = _S_red;
  local_740._M_parent = (_Base_ptr)0x0;
  local_6a0._M_p = (pointer)&local_690;
  local_6b0 = (pointer)0x0;
  pbStack_6a8 = (pointer)0x0;
  local_6c0 = (pointer)0x0;
  pbStack_6b8 = (pointer)0x0;
  local_6d0 = (pointer)0x0;
  _Stack_6c8._M_nxt = (_Hash_node_base *)0x0;
  local_6e0 = (pointer)0x0;
  pbStack_6d8 = (pointer)0x0;
  local_6f0 = (pointer)0x0;
  pbStack_6e8 = (pointer)0x0;
  local_700._M_nxt = (_Hash_node_base *)0x0;
  pbStack_6f8 = (pointer)0x0;
  local_710 = (pointer)0x0;
  pbStack_708 = (pointer)0x0;
  local_720 = (pointer)0x0;
  pbStack_718 = (pointer)0x0;
  local_698 = 0;
  local_690._M_local_buf[0] = '\0';
  local_680 = (_Base_ptr)0x0;
  puStack_678 = (pointer)0x0;
  local_670 = (pointer)0x0;
  output._M_dataplus._M_p = (pointer)paVar18;
  local_808._24_8_ = p_Var1;
  local_7e8 = p_Var1;
  local_7d0._16_8_ = (_Base_ptr)local_7d0;
  local_7d0._24_8_ = (_Base_ptr)local_7d0;
  local_7a0._M_right = local_7a0._M_left;
  local_770._M_right = local_770._M_left;
  local_740._M_right = local_740._M_left;
  psVar11 = cmState::GetSourceDirectory_abi_cxx11_
                      ((this->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  result = cmCMakePresetsGraph::ReadProjectPresets((cmCMakePresetsGraph *)&output,psVar11,false);
  if (result == READ_OK) {
    if (listPresets) {
      iVar9 = 0;
      cmCMakePresetsGraph::PrintBuildPresetList
                ((cmCMakePresetsGraph *)&output,(PrintPrecedingNewline *)0x0);
      goto LAB_00213fe2;
    }
    iVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                     *)local_7d8,presetName);
    if (iVar13._M_node == (_Base_ptr)local_7d0) {
      psVar11 = cmState::GetSourceDirectory_abi_cxx11_
                          ((this->State)._M_t.
                           super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                           super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
      cachePath.field_2._8_8_ = (psVar11->_M_dataplus)._M_p;
      cachePath.field_2._M_allocated_capacity = psVar11->_M_string_length;
      cachePath._M_dataplus._M_p = (pointer)0x18;
      cachePath._M_string_length = (size_type)anon_var_dwarf_51302d;
      projName._M_string_length = (size_type)&projName.field_2;
      projName._M_dataplus._M_p = (pointer)0x1;
      projName.field_2._M_local_buf[0] = 0x22;
      views_01._M_len = 5;
      views_01._M_array = (iterator)&cachePath;
      cmCatViews_abi_cxx11_(&local_928,views_01);
      cmSystemTools::Error(&local_928);
    }
    else {
      if ((char)iVar13._M_node[4]._M_color != _S_black) {
        if (*(char *)&iVar13._M_node[0x18]._M_left == '\0') {
          cachePath._M_dataplus._M_p = (pointer)0x21;
          cachePath._M_string_length = (size_type)anon_var_dwarf_513047;
          projName._M_string_length = (size_type)(presetName->_M_dataplus)._M_p;
          projName._M_dataplus._M_p = (pointer)presetName->_M_string_length;
          cmStrCat<char[27]>(&local_928,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                             (char (*) [27])"\": Invalid macro expansion");
          cmSystemTools::Error(&local_928);
        }
        else {
          if (*(char *)&iVar13._M_node[0x12]._M_parent != '\0') {
            __k = iVar13._M_node + 0x14;
            iVar15 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                             *)local_808,__k);
            config = local_880;
            if (iVar15._M_node == p_Var1) {
              cachePath._M_dataplus._M_p = (pointer)0x1c;
              cachePath._M_string_length = (size_type)anon_var_dwarf_513061;
              psVar11 = cmState::GetSourceDirectory_abi_cxx11_
                                  ((this->State)._M_t.
                                   super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
              projName._M_string_length = (size_type)(psVar11->_M_dataplus)._M_p;
              projName._M_dataplus._M_p = (pointer)psVar11->_M_string_length;
              local_8a8[8] = 0x22;
              cmStrCat<char[4],std::__cxx11::string,char>
                        (&local_928,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                         (char (*) [4])0x7be282,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                         local_8a8 + 8);
              cmSystemTools::Error(&local_928);
            }
            else {
              if ((char)iVar15._M_node[4]._M_color != _S_black) {
                if ((char)iVar15._M_node[0x21]._M_color != _S_red) {
                  if (*(long *)(iVar15._M_node + 0x1d) != 0) {
                    std::__cxx11::string::_M_assign((string *)dir);
                  }
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator=(&(this->UnprocessedPresetEnvironment)._M_t,
                              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&iVar13._M_node[0x12]._M_left);
                  ProcessPresetEnvironment(this);
                  if (((int)local_900 + 1U < 2) &&
                     (*(char *)&iVar13._M_node[0x15]._M_parent == '\x01')) {
                    local_900 = (ulong)*(uint *)&iVar13._M_node[0x15].field_0x4;
                  }
                  pbVar6 = (targets->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  pvVar16 = targets;
                  if (pbVar6 == (targets->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               targets,pbVar6,iVar13._M_node[0x15]._M_left,
                               iVar13._M_node[0x15]._M_right);
                    pvVar16 = extraout_RAX_01;
                  }
                  if (config->_M_string_length == 0) {
                    pvVar16 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)std::__cxx11::string::_M_assign((string *)config);
                  }
                  if ((buildOptions->Clean == false) &&
                     (*(char *)((long)&iVar13._M_node[0x17]._M_parent + 1) == '\x01')) {
                    pvVar16 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT71((int7)((ulong)pvVar16 >> 8),
                                          *(bool *)&iVar13._M_node[0x17]._M_parent);
                    buildOptions->Clean = *(bool *)&iVar13._M_node[0x17]._M_parent;
                  }
                  if ((buildOptions->ResolveMode == Default) &&
                     (*(char *)((long)&iVar13._M_node[0x18]._M_parent + 4) == '\x01')) {
                    pvVar16 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(ulong)*(PackageResolveMode *)&iVar13._M_node[0x18]._M_parent;
                    buildOptions->ResolveMode =
                         *(PackageResolveMode *)&iVar13._M_node[0x18]._M_parent;
                  }
                  uVar17 = (undefined7)((ulong)pvVar16 >> 8);
                  local_904 = (undefined4)CONCAT71(uVar17,1);
                  if (!verbose) {
                    if (*(char *)((long)&iVar13._M_node[0x17]._M_parent + 3) == '\x01') {
                      local_904 = (undefined4)
                                  CONCAT71(uVar17,*(undefined1 *)
                                                   ((long)&iVar13._M_node[0x17]._M_parent + 2));
                    }
                    else {
                      local_904 = 0;
                    }
                  }
                  pbVar6 = (nativeOptions->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if (pbVar6 == (nativeOptions->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               nativeOptions,pbVar6,iVar13._M_node[0x17]._M_left,
                               iVar13._M_node[0x17]._M_right);
                  }
                  cmCMakePresetsGraph::~cmCMakePresetsGraph((cmCMakePresetsGraph *)&output);
                  goto LAB_002137d0;
                }
                cachePath._M_dataplus._M_p = (pointer)0x25;
                cachePath._M_string_length = (size_type)anon_var_dwarf_51307b;
                projName._M_string_length = *(size_type *)(iVar13._M_node + 0x14);
                projName._M_dataplus._M_p = (pointer)iVar13._M_node[0x14]._M_parent;
                cmStrCat<char[27]>(&local_928,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                                   (char (*) [27])"\": Invalid macro expansion");
                cmSystemTools::Error(&local_928);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_928._M_dataplus._M_p != &local_928.field_2) goto LAB_002137b8;
                goto LAB_002137c0;
              }
              cachePath._M_dataplus._M_p = (pointer)0x26;
              cachePath._M_string_length = (size_type)anon_var_dwarf_51306e;
              psVar11 = cmState::GetSourceDirectory_abi_cxx11_
                                  ((this->State)._M_t.
                                   super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
              projName._M_string_length = (size_type)(psVar11->_M_dataplus)._M_p;
              projName._M_dataplus._M_p = (pointer)psVar11->_M_string_length;
              local_8a8[8] = 0x22;
              cmStrCat<char[4],std::__cxx11::string,char>
                        (&local_928,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                         (char (*) [4])0x7be282,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                         local_8a8 + 8);
              cmSystemTools::Error(&local_928);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_928._M_dataplus._M_p != &local_928.field_2) {
              operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1
                             );
            }
            iVar9 = 1;
            PrintPresetList(this,(cmCMakePresetsGraph *)&output);
            goto LAB_00213fe2;
          }
          cachePath._M_dataplus._M_p = (pointer)0x24;
          cachePath._M_string_length = (size_type)anon_var_dwarf_513054;
          psVar11 = cmState::GetSourceDirectory_abi_cxx11_
                              ((this->State)._M_t.
                               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                               super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                               super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
          projName._M_string_length = (size_type)(psVar11->_M_dataplus)._M_p;
          projName._M_dataplus._M_p = (pointer)psVar11->_M_string_length;
          local_8a8[8] = 0x22;
          cmStrCat<char[4],std::__cxx11::string,char>
                    (&local_928,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                     (char (*) [4])0x7be282,presetName,local_8a8 + 8);
          cmSystemTools::Error(&local_928);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_928._M_dataplus._M_p != &local_928.field_2) {
          operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
        }
        iVar9 = 1;
        cmCMakePresetsGraph::PrintBuildPresetList
                  ((cmCMakePresetsGraph *)&output,(PrintPrecedingNewline *)0x0);
        goto LAB_00213fe2;
      }
      psVar11 = cmState::GetSourceDirectory_abi_cxx11_
                          ((this->State)._M_t.
                           super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                           super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
      cachePath.field_2._8_8_ = (psVar11->_M_dataplus)._M_p;
      cachePath.field_2._M_allocated_capacity = psVar11->_M_string_length;
      cachePath._M_dataplus._M_p = (pointer)0x22;
      cachePath._M_string_length = (size_type)anon_var_dwarf_51303a;
      projName._M_string_length = (size_type)&projName.field_2;
      projName._M_dataplus._M_p = (pointer)0x1;
      projName.field_2._M_local_buf[0] = 0x22;
      views_00._M_len = 5;
      views_00._M_array = (iterator)&cachePath;
      cmCatViews_abi_cxx11_(&local_928,views_00);
      cmSystemTools::Error(&local_928);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_928._M_dataplus._M_p != &local_928.field_2) {
      operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
    }
    iVar9 = 1;
    cmCMakePresetsGraph::PrintBuildPresetList
              ((cmCMakePresetsGraph *)&output,(PrintPrecedingNewline *)0x0);
  }
  else {
    psVar11 = cmState::GetSourceDirectory_abi_cxx11_
                        ((this->State)._M_t.
                         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    pcVar2 = (psVar11->_M_dataplus)._M_p;
    sVar3 = psVar11->_M_string_length;
    __s = cmCMakePresetsGraph::ResultToString(result);
    cachePath._M_dataplus._M_p = (pointer)0x1c;
    cachePath._M_string_length = (size_type)anon_var_dwarf_50b68e;
    cachePath.field_2._M_allocated_capacity = sVar3;
    cachePath.field_2._8_8_ = pcVar2;
    strlen(__s);
    views._M_len = 4;
    views._M_array = (iterator)&cachePath;
    cmCatViews_abi_cxx11_(&projName,views);
    cmSystemTools::Error(&projName);
    local_928.field_2._M_allocated_capacity = projName.field_2._M_allocated_capacity;
    local_928._M_dataplus = projName._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)projName._M_dataplus._M_p != &projName.field_2) {
LAB_002137b8:
      operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
    }
LAB_002137c0:
    iVar9 = 1;
  }
LAB_00213fe2:
  cmCMakePresetsGraph::~cmCMakePresetsGraph((cmCMakePresetsGraph *)&output);
  return iVar9;
}

Assistant:

int cmake::Build(int jobs, std::string dir, std::vector<std::string> targets,
                 std::string config, std::vector<std::string> nativeOptions,
                 cmBuildOptions& buildOptions, bool verbose,
                 const std::string& presetName, bool listPresets)
{
  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");

#if !defined(CMAKE_BOOTSTRAP)
  if (!presetName.empty() || listPresets) {
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

    cmCMakePresetsGraph settingsFile;
    auto result = settingsFile.ReadProjectPresets(this->GetHomeDirectory());
    if (result != cmCMakePresetsGraph::ReadFileResult::READ_OK) {
      cmSystemTools::Error(
        cmStrCat("Could not read presets from ", this->GetHomeDirectory(),
                 ": ", cmCMakePresetsGraph::ResultToString(result)));
      return 1;
    }

    if (listPresets) {
      settingsFile.PrintBuildPresetList();
      return 0;
    }

    auto presetPair = settingsFile.BuildPresets.find(presetName);
    if (presetPair == settingsFile.BuildPresets.end()) {
      cmSystemTools::Error(cmStrCat("No such build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    if (presetPair->second.Unexpanded.Hidden) {
      cmSystemTools::Error(cmStrCat("Cannot use hidden build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    auto const& expandedPreset = presetPair->second.Expanded;
    if (!expandedPreset) {
      cmSystemTools::Error(cmStrCat("Could not evaluate build preset \"",
                                    presetName,
                                    "\": Invalid macro expansion"));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    if (!expandedPreset->ConditionResult) {
      cmSystemTools::Error(cmStrCat("Cannot use disabled build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    auto configurePresetPair =
      settingsFile.ConfigurePresets.find(expandedPreset->ConfigurePreset);
    if (configurePresetPair == settingsFile.ConfigurePresets.end()) {
      cmSystemTools::Error(cmStrCat("No such configure preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    expandedPreset->ConfigurePreset, '"'));
      this->PrintPresetList(settingsFile);
      return 1;
    }

    if (configurePresetPair->second.Unexpanded.Hidden) {
      cmSystemTools::Error(cmStrCat("Cannot use hidden configure preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    expandedPreset->ConfigurePreset, '"'));
      this->PrintPresetList(settingsFile);
      return 1;
    }

    auto const& expandedConfigurePreset = configurePresetPair->second.Expanded;
    if (!expandedConfigurePreset) {
      cmSystemTools::Error(cmStrCat("Could not evaluate configure preset \"",
                                    expandedPreset->ConfigurePreset,
                                    "\": Invalid macro expansion"));
      return 1;
    }

    if (!expandedConfigurePreset->BinaryDir.empty()) {
      dir = expandedConfigurePreset->BinaryDir;
    }

    this->UnprocessedPresetEnvironment = expandedPreset->Environment;
    this->ProcessPresetEnvironment();

    if ((jobs == cmake::DEFAULT_BUILD_PARALLEL_LEVEL ||
         jobs == cmake::NO_BUILD_PARALLEL_LEVEL) &&
        expandedPreset->Jobs) {
      jobs = *expandedPreset->Jobs;
    }

    if (targets.empty()) {
      targets.insert(targets.begin(), expandedPreset->Targets.begin(),
                     expandedPreset->Targets.end());
    }

    if (config.empty()) {
      config = expandedPreset->Configuration;
    }

    if (!buildOptions.Clean && expandedPreset->CleanFirst) {
      buildOptions.Clean = *expandedPreset->CleanFirst;
    }

    if (buildOptions.ResolveMode == PackageResolveMode::Default &&
        expandedPreset->ResolvePackageReferences) {
      buildOptions.ResolveMode = *expandedPreset->ResolvePackageReferences;
    }

    if (!verbose && expandedPreset->Verbose) {
      verbose = *expandedPreset->Verbose;
    }

    if (nativeOptions.empty()) {
      nativeOptions.insert(nativeOptions.begin(),
                           expandedPreset->NativeToolOptions.begin(),
                           expandedPreset->NativeToolOptions.end());
    }
  }
#endif

  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return 1;
  }
  cmValue cachedGenerator = this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!cachedGenerator) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
  }
  auto gen = this->CreateGlobalGenerator(*cachedGenerator);
  if (!gen) {
    std::cerr << "Error: could not create CMAKE_GENERATOR \""
              << *cachedGenerator << "\"\n";
    return 1;
  }
  this->SetGlobalGenerator(std::move(gen));
  cmValue cachedGeneratorInstance =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_INSTANCE");
  if (cachedGeneratorInstance) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorInstance(*cachedGeneratorInstance,
                                                     &mf)) {
      return 1;
    }
  }
  cmValue cachedGeneratorPlatform =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_PLATFORM");
  if (cachedGeneratorPlatform) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorPlatform(*cachedGeneratorPlatform,
                                                     &mf)) {
      return 1;
    }
  }
  cmValue cachedGeneratorToolset =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_TOOLSET");
  if (cachedGeneratorToolset) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorToolset(*cachedGeneratorToolset,
                                                    true, &mf)) {
      return 1;
    }
  }
  std::string output;
  std::string projName;
  cmValue cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
  }
  projName = *cachedProjectName;

  if (cmIsOn(this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE"))) {
    verbose = true;
  }

#ifdef CMAKE_HAVE_VS_GENERATORS
  // For VS generators, explicitly check if regeneration is necessary before
  // actually starting the build. If not done separately from the build
  // itself, there is the risk of building an out-of-date solution file due
  // to limitations of the underlying build system.
  std::string const stampList = cachePath + "/" + "CMakeFiles/" +
    cmGlobalVisualStudio9Generator::GetGenerateStampList();

  // Note that the stampList file only exists for VS generators.
  if (cmSystemTools::FileExists(stampList)) {

    // Check if running for Visual Studio 9 - we need to explicitly run
    // the glob verification script before starting the build
    this->AddScriptingCommands();
    if (this->GlobalGenerator->MatchesGeneratorName("Visual Studio 9 2008")) {
      std::string const globVerifyScript =
        cachePath + "/" + "CMakeFiles/" + "VerifyGlobs.cmake";
      if (cmSystemTools::FileExists(globVerifyScript)) {
        std::vector<std::string> args;
        this->ReadListFile(args, globVerifyScript);
      }
    }

    if (!cmakeCheckStampList(stampList)) {
      // Correctly initialize the home (=source) and home output (=binary)
      // directories, which is required for running the generation step.
      std::string homeOrig = this->GetHomeDirectory();
      std::string homeOutputOrig = this->GetHomeOutputDirectory();
      this->SetDirectoriesFromFile(cachePath);

      this->AddProjectCommands();

      int ret = this->Configure();
      if (ret) {
        cmSystemTools::Message("CMake Configure step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      ret = this->Generate();
      if (ret) {
        cmSystemTools::Message("CMake Generate step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      std::string message = cmStrCat("Build files have been written to: ",
                                     this->GetHomeOutputDirectory());
      this->UpdateProgress(message, -1);

      // Restore the previously set directories to their original value.
      this->SetHomeDirectory(homeOrig);
      this->SetHomeOutputDirectory(homeOutputOrig);
    }
  }
#endif

  if (!this->GlobalGenerator->ReadCacheEntriesForBuild(*this->State)) {
    return 1;
  }

  this->GlobalGenerator->PrintBuildCommandAdvice(std::cerr, jobs);
  return this->GlobalGenerator->Build(
    jobs, "", dir, projName, targets, output, "", config, buildOptions,
    verbose, cmDuration::zero(), cmSystemTools::OUTPUT_PASSTHROUGH,
    nativeOptions);
}